

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O3

void TTD::NSSnapType::ParseSnapPropertyRecord
               (SnapPropertyRecord *sRecord,bool readSeparator,FileReader *reader,
               SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  uVar1 = FileReader::ReadUInt32(reader,propertyId,false);
  sRecord->PropertyId = uVar1;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x54,1);
  sRecord->IsNumeric = SUB41(iVar2,0);
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x53,1);
  sRecord->IsBound = SUB41(iVar2,0);
  iVar2 = (*reader->_vptr_FileReader[10])(reader,0x55,1);
  sRecord->IsSymbol = SUB41(iVar2,0);
  (*reader->_vptr_FileReader[3])(reader,0x37,1);
  (*reader->_vptr_FileReader[0x13])(reader,alloc,&sRecord->PropertyName,0);
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseSnapPropertyRecord(SnapPropertyRecord* sRecord, bool readSeparator, FileReader* reader, SlabAllocator& alloc)
        {
            reader->ReadRecordStart(readSeparator);

            sRecord->PropertyId = reader->ReadUInt32(NSTokens::Key::propertyId);

            sRecord->IsNumeric = reader->ReadBool(NSTokens::Key::isNumeric, true);
            sRecord->IsBound = reader->ReadBool(NSTokens::Key::isBound, true);
            sRecord->IsSymbol = reader->ReadBool(NSTokens::Key::isSymbol, true);

            reader->ReadString(NSTokens::Key::name, alloc, sRecord->PropertyName, true);

            reader->ReadRecordEnd();
        }